

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<int,int>::emplace<int_const&>
          (iterator *__return_storage_ptr__,void *this,int *key,int *args)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  QMultiHash<int,_int> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *this;
  if (pDVar1 == (Data *)0x0) {
    local_38.d = (Data *)0x0;
    local_38.m_size = *(qsizetype *)((long)this + 8);
LAB_00487c57:
    QMultiHash<int,_int>::detach((QMultiHash<int,_int> *)this);
    emplace_helper<int_const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<int,_int>::~QMultiHash(&local_38);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_38.m_size = *(qsizetype *)((long)this + 8);
      local_38.d = pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00487c57;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        emplace_helper<int_const&>(__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_00487caf;
    }
    local_38.d = (Data *)CONCAT44(local_38.d._4_4_,*args);
    QMultiHash<int,_int>::emplace_helper<int>
              (__return_storage_ptr__,(QMultiHash<int,_int> *)this,key,(int *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_00487caf:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }